

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void,_supermap::Key<4UL>_>
::find(optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
       *__return_storage_ptr__,
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void,_supermap::Key<4UL>_>
      *this,Key<4UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
            *equal)

{
  _Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>> *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_01;
  ulong uVar5;
  ulong uVar6;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> firstLeqElem;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> KStack_58;
  _Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>> *local_48
  ;
  function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
  *local_40;
  function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
  *local_38;
  undefined4 extraout_var_00;
  
  local_40 = equal;
  local_38 = less;
  iVar3 = (*(this->
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
            ).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
            ._vptr_OrderedStorage[1])(this);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    local_48 = (_Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>
                *)__return_storage_ptr__;
    iVar3 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ._vptr_OrderedStorage[1])(this);
    uVar4 = CONCAT44(extraout_var_00,iVar3);
    uVar5 = 0;
    while (1 < uVar4 - uVar5) {
      uVar6 = uVar4 + uVar5 >> 1;
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        ._vptr_OrderedStorage[4])(&KStack_58,this,uVar6);
      bVar2 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
              ::operator()(local_38,&KStack_58,pattern);
      if ((!bVar2) &&
         (bVar2 = std::
                  function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
                  ::operator()(local_40,&KStack_58,pattern), !bVar2)) {
        uVar4 = uVar6;
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&KStack_58.value.data_);
    }
    iVar3 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ._vptr_OrderedStorage[1])(this);
    __return_storage_ptr__ =
         (optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> *)local_48;
    if (uVar5 < CONCAT44(extraout_var_01,iVar3)) {
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        ._vptr_OrderedStorage[4])(&KStack_58,this,uVar5);
      bVar2 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
              ::operator()(local_40,&KStack_58,pattern);
      p_Var1 = local_48;
      if (bVar2) {
        std::
        _Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>::
        _Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>&>
                  (local_48,&KStack_58);
      }
      else {
        local_48[0x10] =
             (_Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>
              )0x0;
      }
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&KStack_58.value.data_);
      return (optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> *)p_Var1
      ;
    }
  }
  *(_Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>> *)
   ((long)__return_storage_ptr__ + 0x10) =
       (_Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>)0x0
  ;
  return (optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> *)
         (_Optional_payload_base<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>> *
         )__return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }